

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

void ConvexDecomposition::b2bfix(cbtHullTriangle *s,cbtHullTriangle *t)

{
  int a;
  int b;
  int iVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  
  piVar5 = &(s->super_int3).z;
  uVar7 = 2;
  iVar6 = -3;
  while( true ) {
    uVar3 = (ulong)(iVar6 + 4);
    if (iVar6 == -1) {
      uVar3 = 0;
    }
    a = (&(s->super_int3).x)[uVar3];
    b = piVar5[(uVar7 / 3) * -3];
    piVar4 = cbtHullTriangle::neib(s,a,b);
    iVar1 = *piVar4;
    if (((long)iVar1 < 0) || (DAT_00b98040 <= iVar1)) break;
    piVar4 = cbtHullTriangle::neib(*(cbtHullTriangle **)(tris + (long)iVar1 * 8),b,a);
    if (*piVar4 != s->id) {
      __assert_fail("tris[s->neib(a,b)]->neib(b,a) == s->id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x94f,"void ConvexDecomposition::b2bfix(cbtHullTriangle *, cbtHullTriangle *)")
      ;
    }
    piVar4 = cbtHullTriangle::neib(t,a,b);
    iVar1 = *piVar4;
    if (((long)iVar1 < 0) || (DAT_00b98040 <= iVar1)) break;
    piVar4 = cbtHullTriangle::neib(*(cbtHullTriangle **)(tris + (long)iVar1 * 8),b,a);
    if (*piVar4 != t->id) {
      __assert_fail("tris[t->neib(a,b)]->neib(b,a) == t->id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x950,"void ConvexDecomposition::b2bfix(cbtHullTriangle *, cbtHullTriangle *)")
      ;
    }
    piVar4 = cbtHullTriangle::neib(t,b,a);
    iVar1 = *piVar4;
    piVar4 = cbtHullTriangle::neib(s,a,b);
    iVar2 = *piVar4;
    if (((long)iVar2 < 0) || (DAT_00b98040 <= iVar2)) break;
    piVar4 = cbtHullTriangle::neib(*(cbtHullTriangle **)(tris + (long)iVar2 * 8),b,a);
    *piVar4 = iVar1;
    piVar4 = cbtHullTriangle::neib(s,a,b);
    iVar1 = *piVar4;
    piVar4 = cbtHullTriangle::neib(t,b,a);
    iVar2 = *piVar4;
    if (((long)iVar2 < 0) || (DAT_00b98040 <= iVar2)) break;
    piVar4 = cbtHullTriangle::neib(*(cbtHullTriangle **)(tris + (long)iVar2 * 8),a,b);
    *piVar4 = iVar1;
    piVar5 = piVar5 + 1;
    uVar7 = uVar7 + 1;
    iVar6 = iVar6 + 1;
    if (iVar6 == 0) {
      return;
    }
  }
  __assert_fail("i>=0 && i<count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x577,
                "Type &ConvexDecomposition::Array<ConvexDecomposition::cbtHullTriangle *>::operator[](int) [Type = ConvexDecomposition::cbtHullTriangle *]"
               );
}

Assistant:

void b2bfix(cbtHullTriangle* s,cbtHullTriangle*t)
{
	int i;
	for(i=0;i<3;i++) 
	{
		int i1=(i+1)%3;
		int i2=(i+2)%3;
		int a = (*s)[i1];
		int b = (*s)[i2];
		assert(tris[s->neib(a,b)]->neib(b,a) == s->id);
		assert(tris[t->neib(a,b)]->neib(b,a) == t->id);
		tris[s->neib(a,b)]->neib(b,a) = t->neib(b,a);
		tris[t->neib(b,a)]->neib(a,b) = s->neib(a,b);
	}
}